

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ComputeNF(ChElementBeamTaperedTimoshenko *this)

{
  ChVectorDynamic<> *in_RCX;
  double *in_RDX;
  ChVectorDynamic<> *in_RSI;
  ChVectorDynamic<> *in_R8;
  ChVectorDynamic<> *in_R9;
  double in_XMM0_Qa;
  
  ComputeNF((ChElementBeamTaperedTimoshenko *)&this[-1].disable_corotate,in_XMM0_Qa,in_RSI,in_RDX,
            in_RCX,in_R8,in_R9);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::ComputeNF(const double U,
                                               ChVectorDynamic<>& Qi,
                                               double& detJ,
                                               const ChVectorDynamic<>& F,
                                               ChVectorDynamic<>* state_x,
                                               ChVectorDynamic<>* state_w) {
    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, U);
    ShapeFunctionN N = std::get<0>(NN);

    // eta = 2*x/L;
    // ---> Deta/dx = 2./L;
    // ---> detJ = dx/Deta = L/2.;
    detJ = this->GetRestLength() / 2.0;

    Qi = N.transpose() * F;
}